

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

char * Ndr_ObjWriteConstant(uint *pBits,int nBits)

{
  size_t sVar1;
  uint uVar2;
  
  if (nBits < 0x2706) {
    sprintf(Ndr_ObjWriteConstant::Buffer,"%d\'b",(ulong)(uint)nBits);
    sVar1 = strlen(Ndr_ObjWriteConstant::Buffer);
    if (0 < nBits) {
      sVar1 = (size_t)(int)sVar1;
      uVar2 = nBits + 1;
      do {
        Ndr_ObjWriteConstant::Buffer[sVar1] =
             (pBits[uVar2 - 2 >> 5] >> (uVar2 - 2 & 0x1f) & 1) != 0 | 0x30;
        sVar1 = sVar1 + 1;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    Ndr_ObjWriteConstant::Buffer[(int)sVar1] = '\0';
    return Ndr_ObjWriteConstant::Buffer;
  }
  __assert_fail("nBits + 10 < 10000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                ,0xb6,"char *Ndr_ObjWriteConstant(unsigned int *, int)");
}

Assistant:

char * Ndr_ObjWriteConstant( unsigned * pBits, int nBits )
{
    static char Buffer[10000]; int i, Len;
    assert( nBits + 10 < 10000 );
    sprintf( Buffer, "%d\'b", nBits );
    Len = strlen(Buffer);
    for ( i = nBits-1; i >= 0; i-- )
        Buffer[Len++] = '0' + Abc_InfoHasBit(pBits, i);
    Buffer[Len] = 0;
    return Buffer;
}